

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
BaseDictionary<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::SetNextFreeEntryIndex
          (BaseDictionary<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,EntryType *freeEntry,int nextFreeEntryIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int local_2c;
  int nextFreeEntryIndex_local;
  EntryType *freeEntry_local;
  BaseDictionary<Js::EvalMapStringInternal<true>,_Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_Js::FastEvalMapStringComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  bVar2 = IsFreeEntry(freeEntry);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,799,"(!IsFreeEntry(freeEntry))","!IsFreeEntry(freeEntry)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (nextFreeEntryIndex < -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,800,"(nextFreeEntryIndex >= -1)","nextFreeEntryIndex >= -1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (this->count <= nextFreeEntryIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x321,"(nextFreeEntryIndex < count)","nextFreeEntryIndex < count");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (nextFreeEntryIndex < 0) {
    local_2c = -2;
  }
  else {
    local_2c = -2 - nextFreeEntryIndex;
  }
  (freeEntry->
  super_DefaultHashedEntry<Js::EvalMapStringInternal<true>,_Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
  ).
  super_KeyValueEntry<Js::EvalMapStringInternal<true>,_Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_>_>
  .
  super_ValueEntry<Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::EvalMapStringInternal<true>,_Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_>_>_>
  .
  super_KeyValueEntryDataLayout2<Js::EvalMapStringInternal<true>,_Memory::WriteBarrierPtr<Js::TwoLevelHashRecord<Js::EvalMapStringInternal<true>,_Js::ScriptFunction_*,_JsUtil::BaseDictionary<Js::EvalMapStringInternal<false>,_Js::ScriptFunction_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_Js::EvalMapStringInternal<false>_>_>_>
  .next = local_2c;
  return;
}

Assistant:

void SetNextFreeEntryIndex(EntryType &freeEntry, const int nextFreeEntryIndex)
        {
            Assert(!IsFreeEntry(freeEntry));
            Assert(nextFreeEntryIndex >= -1);
            Assert(nextFreeEntryIndex < count);

            // The last entry in the free list chain will have a next of FreeListSentinel to indicate that it is a free entry. The end of the
            // free list chain is identified using freeCount.
            freeEntry.next = nextFreeEntryIndex >= 0 ? FreeListSentinel - nextFreeEntryIndex : FreeListSentinel;
        }